

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LevelBlock.test.cpp
# Opt level: O1

string * chunk_abi_cxx11_(void)

{
  string *in_RDI;
  
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)in_RDI,
             " 3.140000+0 6.280000+0        314        628          0          2943740 51     \n 3.000000+0 1.000000+0         55         66          0          1943740 51     \n 0.000000+0 0.000000+0          0          5          7          3943740 51     \n 0.000000+0 1.000000+2 2.000000+2 1.000000+0 2.000000+0 3.000000+0943740 51     \n 4.000000+0                                                       943740 51     \n 3.000000+0 1.000000+0         77         88          0          1943740 51     \n 0.000000+0 0.000000+0          0          5          7          3943740 51     \n 0.000000+0 1.000000+2 2.000000+2 1.000000+0 2.000000+0 3.000000+0943740 51     \n 4.000000+0                                                       943740 51     \n"
             ,"");
  return in_RDI;
}

Assistant:

std::string chunk() {
  return
    " 3.140000+0 6.280000+0        314        628          0          2943740 51     \n"
    " 3.000000+0 1.000000+0         55         66          0          1943740 51     \n"
    " 0.000000+0 0.000000+0          0          5          7          3943740 51     \n"
    " 0.000000+0 1.000000+2 2.000000+2 1.000000+0 2.000000+0 3.000000+0943740 51     \n"
    " 4.000000+0                                                       943740 51     \n"
    " 3.000000+0 1.000000+0         77         88          0          1943740 51     \n"
    " 0.000000+0 0.000000+0          0          5          7          3943740 51     \n"
    " 0.000000+0 1.000000+2 2.000000+2 1.000000+0 2.000000+0 3.000000+0943740 51     \n"
    " 4.000000+0                                                       943740 51     \n";
}